

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall
embree::TutorialApplication::keyboardFunc
          (TutorialApplication *this,GLFWwindow *window_in,int key,int scancode,int action,int mods)

{
  uint uVar1;
  uint uVar2;
  Col4<unsigned_char> *color;
  ImGuiIO *pIVar3;
  GLFWwindow *window;
  ostream *poVar4;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  int iVar5;
  TutorialApplication *pTVar6;
  float fVar7;
  allocator local_51;
  Ref<embree::Image> image;
  string local_48;
  
  ImGui_ImplGlfw_KeyCallback(window_in,key,scancode,action,mods);
  pIVar3 = ImGui::GetIO();
  if (pIVar3->WantCaptureKeyboard != false) {
    return;
  }
  if (action == 0) {
    if ((key == 0x41) || (key == 0x44)) {
      (this->moveDelta).field_0.field_0.x = 0.0;
      return;
    }
    if ((key != 0x53) && (key != 0x57)) {
      return;
    }
    (this->moveDelta).field_0.field_0.z = 0.0;
    return;
  }
  if (action != 1) {
    return;
  }
  (*(this->super_Application)._vptr_Application[4])(this,(ulong)(uint)key);
  if ((mods & 2U) != 0) {
    switch(key) {
    case 0x106:
      iVar5 = this->debug_int1 + 1;
      break;
    case 0x107:
      iVar5 = this->debug_int1 + -1;
      break;
    case 0x108:
      iVar5 = this->debug_int0 + -1;
      goto LAB_0011f799;
    case 0x109:
      iVar5 = this->debug_int0 + 1;
LAB_0011f799:
      this->debug_int0 = iVar5;
      rtcSetDeviceProperty(0,1000000);
      poVar4 = std::operator<<((ostream *)&std::cout,"debug_int0");
      poVar4 = std::operator<<(poVar4," = ");
      iVar5 = this->debug_int0;
      goto LAB_0011f819;
    default:
      goto switchD_0011f6b7_caseD_101;
    }
    this->debug_int1 = iVar5;
    rtcSetDeviceProperty(0,0xf4241);
    poVar4 = std::operator<<((ostream *)&std::cout,"debug_int1");
    poVar4 = std::operator<<(poVar4," = ");
    iVar5 = this->debug_int1;
LAB_0011f819:
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    goto LAB_0011f821;
  }
  switch(key) {
  case 0x100:
switchD_0011f6b7_caseD_100:
    glfwSetWindowShouldClose(this->window,1);
    return;
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
    goto switchD_0011f6b7_caseD_101;
  case 0x106:
    fVar7 = 0.02;
    goto LAB_0011f93c;
  case 0x107:
    fVar7 = -0.02;
LAB_0011f93c:
    Camera::rotate(&this->camera,fVar7,0.0);
    return;
  case 0x108:
    fVar7 = -this->speed;
    goto LAB_0011f901;
  case 0x109:
    fVar7 = this->speed;
LAB_0011f901:
    Camera::move(&this->camera,0.0,0.0,fVar7);
    return;
  case 0x10a:
    fVar7 = this->speed * 1.2;
    break;
  case 0x10b:
    fVar7 = this->speed / 1.2;
    break;
  case 0x10c:
    fVar7 = g_debug + 0.01;
    goto LAB_0011f992;
  case 0x10d:
    fVar7 = g_debug + -0.01;
LAB_0011f992:
    if (1.0 <= fVar7) {
      fVar7 = 1.0;
    }
    g_debug = 0.0;
    if (0.0 <= fVar7) {
      g_debug = fVar7;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"g_debug");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,g_debug);
LAB_0011f821:
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  default:
    switch(key) {
    case 0x41:
      (this->moveDelta).field_0.field_0.x = -1.0;
      break;
    case 0x42:
    case 0x45:
      break;
    case 0x43:
      Camera::str_abi_cxx11_(&local_48,&this->camera);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_48);
      break;
    case 0x44:
      (this->moveDelta).field_0.field_0.x = 1.0;
      break;
    case 0x46:
      glfwDestroyWindow(this->window);
      pTVar6 = this;
      if (this->fullscreen == true) {
        this->width = this->window_width;
        this->height = this->window_height;
        window = createStandardWindow(this,this->window_width,this->window_height);
      }
      else {
        this->window_width = this->width;
        this->window_height = this->height;
        window = createFullScreenWindow(this);
      }
      this->window = window;
      setCallbackFunctions(pTVar6,window);
      glfwMakeContextCurrent(this->window);
      this->fullscreen = (bool)(this->fullscreen ^ 1);
      break;
    default:
      if (key == 0x20) {
        this_00 = (ImageT<embree::Col4<unsigned_char>_> *)::operator_new(0x48);
        uVar1 = this->width;
        uVar2 = this->height;
        color = (Col4<unsigned_char> *)this->pixels;
        std::__cxx11::string::string((string *)&local_48,"",&local_51);
        ImageT<embree::Col4<unsigned_char>_>::ImageT
                  (this_00,(ulong)uVar1,(ulong)uVar2,color,true,&local_48,true);
        image.ptr = (Image *)this_00;
        (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
        std::__cxx11::string::~string((string *)&local_48);
        FileName::FileName((FileName *)&local_48,"screenshot.tga");
        storeImage(&image,(FileName *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        if (image.ptr != (Image *)0x0) {
          (*((image.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
      }
      else {
        if (key == 0x51) goto switchD_0011f6b7_caseD_100;
        if (key == 0x53) {
          (this->moveDelta).field_0.field_0.z = -1.0;
        }
        else if (key == 0x57) {
          (this->moveDelta).field_0.field_0.z = 1.0;
        }
      }
    }
    goto switchD_0011f6b7_caseD_101;
  }
  this->speed = fVar7;
switchD_0011f6b7_caseD_101:
  return;
}

Assistant:

void TutorialApplication::keyboardFunc(GLFWwindow* window_in, int key, int scancode, int action, int mods)
  {
    ImGui_ImplGlfw_KeyCallback(window_in,key,scancode,action,mods);
    if (ImGui::GetIO().WantCaptureKeyboard) return;
      
    if (action == GLFW_PRESS)
    {
      /* call tutorial keyboard handler */
      keypressed(key);

      if (mods & GLFW_MOD_CONTROL)
      {
        switch (key) {
        case GLFW_KEY_UP        : debug_int0++; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_DOWN      : debug_int0--; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_LEFT      : debug_int1--; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        case GLFW_KEY_RIGHT     : debug_int1++; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        }
      }
      else
      {
        switch (key) {
        case GLFW_KEY_LEFT      : camera.rotate(-0.02f,0.0f); break;
        case GLFW_KEY_RIGHT     : camera.rotate(+0.02f,0.0f); break;
        case GLFW_KEY_UP        : camera.move(0.0f,0.0f,+speed); break;
        case GLFW_KEY_DOWN      : camera.move(0.0f,0.0f,-speed); break;
        case GLFW_KEY_PAGE_UP   : speed *= 1.2f; break;
        case GLFW_KEY_PAGE_DOWN : speed /= 1.2f; break;

        case GLFW_KEY_W : moveDelta.z = +1.0f; break;
        case GLFW_KEY_S : moveDelta.z = -1.0f; break;
        case GLFW_KEY_A : moveDelta.x = -1.0f; break;
        case GLFW_KEY_D : moveDelta.x = +1.0f; break;
          
        case GLFW_KEY_F :
          glfwDestroyWindow(window);
          if (fullscreen) {
            width = window_width;
            height = window_height;
            window = createStandardWindow(width,height);
            setCallbackFunctions(window);
          }
          else {
            window_width = width;
            window_height = height;
            window = createFullScreenWindow();
            setCallbackFunctions(window);
          }
          glfwMakeContextCurrent(window);
          fullscreen = !fullscreen;
          break;
          
        case GLFW_KEY_C : std::cout << camera.str() << std::endl; break;
        case GLFW_KEY_HOME: g_debug=clamp(g_debug+0.01f); PRINT(g_debug); break;
        case GLFW_KEY_END : g_debug=clamp(g_debug-0.01f); PRINT(g_debug); break;
          
        case GLFW_KEY_SPACE: {
          Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels, true, "", true);
          storeImage(image, "screenshot.tga");
          break;
        }
          
        case GLFW_KEY_ESCAPE:
        case GLFW_KEY_Q: 
          glfwSetWindowShouldClose(window,1);
          break;
        }
      }
    }
    else if (action == GLFW_RELEASE)
    {
      switch (key)
      {
      case GLFW_KEY_W : moveDelta.z = 0.0f; break;
      case GLFW_KEY_S : moveDelta.z = 0.0f; break;
      case GLFW_KEY_A : moveDelta.x = 0.0f; break;
      case GLFW_KEY_D : moveDelta.x = 0.0f; break;
      }
    }
  }